

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttrListImpl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::VecAttrListImpl::getValue(VecAttrListImpl *this,char *name)

{
  bool bVar1;
  XMLAttr *this_00;
  XMLCh *str1;
  XMLAttr *curElem;
  XMLSize_t index;
  ArrayJanitor<char16_t> janName;
  XMLCh *wideName;
  char *name_local;
  VecAttrListImpl *this_local;
  
  janName.fMemoryManager =
       (MemoryManager *)XMLString::transcode(name,XMLPlatformUtils::fgMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&index,(char16_t *)janName.fMemoryManager,
             XMLPlatformUtils::fgMemoryManager);
  curElem = (XMLAttr *)0x0;
  do {
    if ((XMLAttr *)this->fCount <= curElem) {
      this_local = (VecAttrListImpl *)0x0;
LAB_003775c5:
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&index);
      return (XMLCh *)this_local;
    }
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                         (XMLSize_t)curElem);
    str1 = XMLAttr::getQName(this_00);
    bVar1 = XMLString::equals(str1,(XMLCh *)janName.fMemoryManager);
    if (bVar1) {
      this_local = (VecAttrListImpl *)XMLAttr::getValue(this_00);
      goto LAB_003775c5;
    }
    curElem = (XMLAttr *)&curElem->field_0x1;
  } while( true );
}

Assistant:

const XMLCh* VecAttrListImpl::getValue(const char* const name) const
{
    // Temporarily transcode the name for lookup
    XMLCh* wideName = XMLString::transcode(name, XMLPlatformUtils::fgMemoryManager);
    ArrayJanitor<XMLCh> janName(wideName, XMLPlatformUtils::fgMemoryManager);

    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), wideName))
            return curElem->getValue();
    }
    return 0;
}